

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,_kj::WebSocket::ProtocolError>
* __thiscall
kj::anon_unknown_36::WebSocketImpl::ZlibContext::processLoop
          (OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,_kj::WebSocket::ProtocolError>
           *__return_storage_ptr__,ZlibContext *this,Maybe<unsigned_long> *maxSize)

{
  bool bVar1;
  Result *params;
  Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> *other;
  ProtocolError local_b0;
  unsigned_long *local_98;
  unsigned_long *m;
  unsigned_long *_m3398;
  size_t bytesProcessed;
  int status;
  undefined1 local_70 [8];
  Result result;
  size_t totalBytesProcessed;
  Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> output;
  Maybe<unsigned_long> *maxSize_local;
  ZlibContext *this_local;
  
  output.builder.disposer = (ArrayDisposer *)maxSize;
  Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>::Vector
            ((Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> *)
             &totalBytesProcessed);
  result.size = 0;
  do {
    pumpOnce((Result *)local_70,this);
    bytesProcessed._0_4_ = local_70._0_4_;
    _m3398 = (unsigned_long *)result.buffer.disposer;
    if (result.buffer.disposer == (ArrayDisposer *)0x0) {
LAB_00647add:
      if ((((this->ctx).avail_in == 0) && ((this->ctx).avail_out != 0)) ||
         ((int)bytesProcessed == 1)) {
        if ((int)bytesProcessed == 1) {
          reset(this);
        }
        other = mv<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>>
                          ((Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> *)
                           &totalBytesProcessed);
        OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,kj::WebSocket::ProtocolError>
        ::OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,int>
                  ((OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,kj::WebSocket::ProtocolError>
                    *)__return_storage_ptr__,other);
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
    }
    else {
      params = mv<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>((Result *)local_70)
      ;
      Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>::
      add<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>
                ((Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> *)
                 &totalBytesProcessed,params);
      result.size = result.size + (long)_m3398;
      m = kj::_::readMaybe<unsigned_long>(maxSize);
      if ((m == (unsigned_long *)0x0) || (local_98 = m, result.size <= *m)) goto LAB_00647add;
      local_b0.statusCode = 0x3f1;
      StringPtr::StringPtr(&local_b0.description,"Message is too large");
      OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,kj::WebSocket::ProtocolError>
      ::OneOf<kj::WebSocket::ProtocolError,int>
                ((OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,kj::WebSocket::ProtocolError>
                  *)__return_storage_ptr__,&local_b0);
      bVar1 = true;
    }
    Result::~Result((Result *)local_70);
    if (bVar1) {
      Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>::~Vector
                ((Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> *)
                 &totalBytesProcessed);
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

kj::OneOf<kj::Vector<Result>, ProtocolError> processLoop(kj::Maybe<size_t> maxSize) {
      // Since Zlib buffers the writes, we want to continue processing until there's nothing left.
      kj::Vector<Result> output;
      size_t totalBytesProcessed = 0;
      for (;;) {
        Result result = pumpOnce();

        auto status = result.processResult;
        auto bytesProcessed = result.size;
        if (bytesProcessed > 0) {
          output.add(kj::mv(result));
          totalBytesProcessed += bytesProcessed;
          KJ_IF_SOME(m, maxSize) {
            // This is only non-null for `receive` calls, so we must be decompressing. We don't want
            // the decompressed message to OOM us, so let's make sure it's not too big.
            if (totalBytesProcessed > m) {
              return ProtocolError {
                  .statusCode = 1009,
                  .description = "Message is too large"};
            }
          }
        }

        if ((ctx.avail_in == 0 && ctx.avail_out != 0) || status == Z_STREAM_END) {
          // If we're out of input to consume, and we have space in the output buffer, then we must
          // have flushed the remaining message, so we're done pumping. Alternatively, if we found a
          // BFINAL deflate block, then we know the stream is completely finished.
          if (status == Z_STREAM_END) {
            reset();
          }
          return kj::mv(output);
        }
      }
    }